

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printT2AddrModeImm8Operand(MCInst *MI,uint OpNum,SStream *O,_Bool AlwaysPrintImm0)

{
  uint uVar1;
  MCOperand *op;
  cs_struct *h;
  int64_t iVar2;
  byte in_CL;
  MCInst *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  bool bVar3;
  _Bool isSub;
  int32_t OffImm;
  MCOperand *MO2;
  MCOperand *MO1;
  char *in_stack_ffffffffffffffb8;
  cs_struct *s;
  MCInst *in_stack_ffffffffffffffc0;
  MCInst *MI_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  h = (cs_struct *)MCInst_getOperand(in_RDI,in_ESI + 1);
  SStream_concat0((SStream *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  set_mem_access(in_stack_ffffffffffffffc0,SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
  s = in_RDI->csh;
  MI_00 = in_RDX;
  MCOperand_getReg(op);
  printRegName(h,(SStream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (uint)((ulong)MI_00 >> 0x20));
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    uVar1 = MCOperand_getReg(op);
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar1;
  }
  iVar2 = MCOperand_getImm((MCOperand *)h);
  uVar1 = (uint)iVar2;
  bVar3 = (int)uVar1 < 0;
  if (uVar1 == 0x80000000) {
    uVar1 = 0;
  }
  if (bVar3) {
    SStream_concat((SStream *)in_RDX,", #-0x%x",(ulong)-uVar1);
  }
  else if (((in_CL & 1) != 0) || (0 < (int)uVar1)) {
    if ((int)uVar1 < 10) {
      SStream_concat((SStream *)in_RDX,", #%u",(ulong)uVar1);
    }
    else {
      SStream_concat((SStream *)in_RDX,", #0x%x",(ulong)uVar1);
    }
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    *(uint *)(in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x51) = uVar1;
  }
  SStream_concat0((SStream *)MI_00,(char *)s);
  set_mem_access(MI_00,SUB81((ulong)s >> 0x38,0));
  return;
}

Assistant:

static void printT2AddrModeImm8Operand(MCInst *MI, unsigned OpNum, SStream *O,
		bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	int32_t OffImm;
	bool isSub;

	SStream_concat0(O, "[");
	set_mem_access(MI, true);

	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);

	OffImm = (int32_t)MCOperand_getImm(MO2);
	isSub = OffImm < 0;
	// Don't print +0.
	if (OffImm == INT32_MIN)
		OffImm = 0;

	if (isSub)
		SStream_concat(O, ", #-0x%x", -OffImm);
	else if (AlwaysPrintImm0 || OffImm > 0) {
		if (OffImm > HEX_THRESHOLD)
			SStream_concat(O, ", #0x%x", OffImm);
		else
			SStream_concat(O, ", #%u", OffImm);
	}

	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = OffImm;
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}